

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O0

_Bool Hacl_Bignum64_mod(uint32_t len,uint64_t *n,uint64_t *a,uint64_t *res)

{
  uint64_t uVar1;
  long lVar2;
  uint64_t *puVar3;
  uint32_t uVar4;
  uint64_t *puVar5;
  uint64_t *a_00;
  uint64_t *n_00;
  uint len_00;
  uint32_t len_01;
  uint64_t uVar6;
  ulong uVar7;
  undefined8 *__s;
  uint64_t *__s_00;
  uint64_t uStack_b0;
  uint64_t *local_a8 [2];
  uint64_t local_98;
  uint64_t mu;
  unsigned_long __vla_expr1;
  uint32_t local_7c;
  ulong uStack_78;
  uint32_t nBits;
  uint64_t is_valid_m;
  uint64_t m1;
  uint64_t blt;
  uint64_t beq;
  ulong uStack_50;
  uint32_t i;
  uint64_t acc;
  uint64_t m0;
  uint64_t bit0;
  unsigned_long __vla_expr0;
  uint64_t *local_28;
  uint64_t *res_local;
  uint64_t *a_local;
  uint64_t *n_local;
  uint32_t len_local;
  
  __vla_expr0 = (unsigned_long)local_a8;
  local_28 = res;
  res_local = a;
  a_local = n;
  n_local._4_4_ = len;
  if (0x1fffffffffffffff < (ulong)len) {
    uStack_b0 = 0x2eb886;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum64.c"
           ,0xa1);
    uStack_b0 = 0x2eb890;
    exit(0xfd);
  }
  bit0 = (uint64_t)len;
  lVar2 = -(bit0 * 8 + 0xf & 0xfffffffffffffff0);
  __s = (undefined8 *)((long)local_a8 + lVar2);
  local_a8[1] = __s;
  *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x2eb8cc;
  memset(__s,0,(ulong)len << 3);
  puVar3 = local_a8[1];
  uVar7 = (ulong)n_local._4_4_;
  *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x2eb8e3;
  memset(puVar3,0,uVar7 << 3);
  *local_a8[1] = 1;
  m0 = *a_local & 1;
  acc = -m0;
  uStack_50 = 0;
  for (beq._4_4_ = 0; len_00 = n_local._4_4_, puVar3 = a_local, beq._4_4_ < n_local._4_4_;
      beq._4_4_ = beq._4_4_ + 1) {
    uVar6 = local_a8[1][beq._4_4_];
    uVar1 = a_local[beq._4_4_];
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x2eb943;
    blt = FStar_UInt64_eq_mask(uVar6,uVar1);
    uVar6 = local_a8[1][beq._4_4_];
    uVar1 = a_local[beq._4_4_];
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x2eb968;
    uVar6 = FStar_UInt64_gte_mask(uVar6,uVar1);
    m1 = uVar6 ^ 0xffffffffffffffff;
    uStack_50 = blt & uStack_50 | (blt ^ 0xffffffffffffffff) & m1;
  }
  is_valid_m = uStack_50;
  uStack_78 = acc & uStack_50;
  *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x2eb9cf;
  uVar6 = Hacl_Bignum_Lib_bn_get_top_index_u64(len_00,puVar3);
  puVar3 = local_28;
  local_7c = (int)uVar6 << 6;
  if (uStack_78 == 0xffffffffffffffff) {
    if (0x1fffffffffffffff < (ulong)n_local._4_4_) {
      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x2eba0e;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum64.c"
             ,0xb4);
      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x2eba18;
      exit(0xfd);
    }
    mu = (uint64_t)n_local._4_4_;
    __s_00 = (uint64_t *)((long)__s - (mu * 8 + 0xf & 0xfffffffffffffff0));
    uVar7 = (ulong)n_local._4_4_;
    local_a8[0] = __s_00;
    __vla_expr1 = (unsigned_long)__s;
    __s_00[-1] = 0x2eba59;
    memset(__s_00,0,uVar7 << 3);
    len_01 = n_local._4_4_;
    puVar5 = a_local;
    uVar4 = local_7c;
    puVar3 = local_a8[0];
    __s_00[-1] = 0x2eba6f;
    Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(len_01,uVar4,puVar5,puVar3);
    uVar6 = *a_local;
    __s_00[-1] = 0x2eba7b;
    uVar6 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar6);
    uVar4 = n_local._4_4_;
    n_00 = a_local;
    a_00 = res_local;
    puVar5 = local_28;
    puVar3 = local_a8[0];
    local_98 = uVar6;
    __s_00[-1] = 0x2ebaa4;
    bn_slow_precomp(uVar4,n_00,uVar6,puVar3,a_00,puVar5);
  }
  else {
    uVar7 = (ulong)n_local._4_4_;
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x2ebac1;
    memset(puVar3,0,uVar7 << 3);
  }
  return uStack_78 == 0xffffffffffffffff;
}

Assistant:

bool Hacl_Bignum64_mod(uint32_t len, uint64_t *n, uint64_t *a, uint64_t *res)
{
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t one[len];
  memset(one, 0U, len * sizeof (uint64_t));
  memset(one, 0U, len * sizeof (uint64_t));
  one[0U] = 1ULL;
  uint64_t bit0 = n[0U] & 1ULL;
  uint64_t m0 = 0ULL - bit0;
  uint64_t acc = 0ULL;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t beq = FStar_UInt64_eq_mask(one[i], n[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(one[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL)));
  }
  uint64_t m1 = acc;
  uint64_t is_valid_m = m0 & m1;
  uint32_t nBits = 64U * (uint32_t)Hacl_Bignum_Lib_bn_get_top_index_u64(len, n);
  if (is_valid_m == 0xFFFFFFFFFFFFFFFFULL)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t r2[len];
    memset(r2, 0U, len * sizeof (uint64_t));
    Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(len, nBits, n, r2);
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    bn_slow_precomp(len, n, mu, r2, a, res);
  }
  else
  {
    memset(res, 0U, len * sizeof (uint64_t));
  }
  return is_valid_m == 0xFFFFFFFFFFFFFFFFULL;
}